

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XSValueTest.cpp
# Opt level: O2

void test_dt_NCName_ID_IDREF_ENTITY(DataType dt)

{
  char *pcVar1;
  char cVar2;
  XMLCh *pXVar3;
  XSValue *pXVar4;
  char *pcVar5;
  char *pcVar6;
  long lVar7;
  Status SVar8;
  void *pvVar9;
  int iVar10;
  Status myStatus;
  StrX local_88;
  char iv_3 [5];
  char v_3 [5];
  char iv_1 [9];
  char v_1 [8];
  char v_2 [12];
  char iv_2 [13];
  int iVar11;
  
  builtin_strncpy(v_1,"Four-_.",8);
  builtin_strncpy(v_2,"_Zeerochert",0xc);
  builtin_strncpy(v_3,"L007",5);
  builtin_strncpy(iv_1,":Four-_.",9);
  builtin_strncpy(iv_2 + 8,"ert:",5);
  builtin_strncpy(iv_2,"_Zeeroch",8);
  builtin_strncpy(iv_3,"0:07",5);
  myStatus = st_Init;
  StrX::StrX(&local_88,v_1);
  cVar2 = xercesc_4_0::XSValue::validate
                    (local_88.fUnicodeForm,dt,&myStatus,ver_10,
                     xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  StrX::~StrX(&local_88);
  if (cVar2 == '\0') {
    pXVar3 = getDataTypeString(dt);
    StrX::StrX(&local_88,pXVar3);
    printf("VALIDATE_TEST Validation Fail:                                                       at line <%d>, data=<%s>, datatype=<%s>, expRetVal=<%d>\n"
           ,0x1784,v_1,local_88.fLocalForm,1);
    StrX::~StrX(&local_88);
    errSeen = 1;
  }
  myStatus = st_Init;
  StrX::StrX(&local_88,v_2);
  cVar2 = xercesc_4_0::XSValue::validate
                    (local_88.fUnicodeForm,dt,&myStatus,ver_10,
                     xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  StrX::~StrX(&local_88);
  if (cVar2 == '\0') {
    pXVar3 = getDataTypeString(dt);
    StrX::StrX(&local_88,pXVar3);
    printf("VALIDATE_TEST Validation Fail:                                                       at line <%d>, data=<%s>, datatype=<%s>, expRetVal=<%d>\n"
           ,0x1785,v_2,local_88.fLocalForm,1);
    StrX::~StrX(&local_88);
    errSeen = 1;
  }
  myStatus = st_Init;
  StrX::StrX(&local_88,v_3);
  cVar2 = xercesc_4_0::XSValue::validate
                    (local_88.fUnicodeForm,dt,&myStatus,ver_10,
                     xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  StrX::~StrX(&local_88);
  if (cVar2 == '\0') {
    pXVar3 = getDataTypeString(dt);
    StrX::StrX(&local_88,pXVar3);
    printf("VALIDATE_TEST Validation Fail:                                                       at line <%d>, data=<%s>, datatype=<%s>, expRetVal=<%d>\n"
           ,0x1786,v_3,local_88.fLocalForm,1);
    StrX::~StrX(&local_88);
    errSeen = 1;
  }
  myStatus = st_Init;
  StrX::StrX(&local_88,iv_1);
  cVar2 = xercesc_4_0::XSValue::validate
                    (local_88.fUnicodeForm,dt,&myStatus,ver_10,
                     xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  StrX::~StrX(&local_88);
  if (cVar2 != '\0') {
    pXVar3 = getDataTypeString(dt);
    StrX::StrX(&local_88,pXVar3);
    printf("VALIDATE_TEST Validation Fail:                                                       at line <%d>, data=<%s>, datatype=<%s>, expRetVal=<%d>\n"
           ,0x1789,iv_1,local_88.fLocalForm,0);
    StrX::~StrX(&local_88);
    errSeen = 1;
  }
  myStatus = st_Init;
  StrX::StrX(&local_88,iv_2);
  cVar2 = xercesc_4_0::XSValue::validate
                    (local_88.fUnicodeForm,dt,&myStatus,ver_10,
                     xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  StrX::~StrX(&local_88);
  if (cVar2 != '\0') {
    pXVar3 = getDataTypeString(dt);
    StrX::StrX(&local_88,pXVar3);
    printf("VALIDATE_TEST Validation Fail:                                                       at line <%d>, data=<%s>, datatype=<%s>, expRetVal=<%d>\n"
           ,0x178a,iv_2,local_88.fLocalForm,0);
    StrX::~StrX(&local_88);
    errSeen = 1;
  }
  myStatus = st_Init;
  StrX::StrX(&local_88,iv_3);
  cVar2 = xercesc_4_0::XSValue::validate
                    (local_88.fUnicodeForm,dt,&myStatus,ver_10,
                     xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  StrX::~StrX(&local_88);
  if (cVar2 != '\0') {
    pXVar3 = getDataTypeString(dt);
    StrX::StrX(&local_88,pXVar3);
    printf("VALIDATE_TEST Validation Fail:                                                       at line <%d>, data=<%s>, datatype=<%s>, expRetVal=<%d>\n"
           ,0x178b,iv_3,local_88.fLocalForm,0);
    StrX::~StrX(&local_88);
    errSeen = 1;
  }
  iVar11 = 2;
  while (iVar10 = iVar11 + -1, iVar11 != 0) {
    myStatus = st_Init;
    StrX::StrX(&local_88,v_1);
    pXVar4 = (XSValue *)
             xercesc_4_0::XSValue::getActualValue
                       (local_88.fUnicodeForm,dt,&myStatus,ver_10,iVar11 == 2,
                        xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    StrX::~StrX(&local_88);
    if (pXVar4 == (XSValue *)0x0) {
      if (myStatus != st_NoActVal) {
        pXVar3 = getDataTypeString(dt);
        StrX::StrX(&local_88,pXVar3);
        pcVar1 = local_88.fLocalForm;
        pcVar5 = getStatusString(myStatus);
        printf("ACTVALUE_TEST Context Diff,                                                            at line <%d> data=<%s>, datatype=<%s>,                                                 expStatus=<%s>, actStatus=<%s>\n"
               ,0x17a5,v_1,pcVar1,"st_NoActVal",pcVar5);
        StrX::~StrX(&local_88);
        errSeen = 1;
      }
    }
    else {
      pXVar3 = getDataTypeString(dt);
      StrX::StrX(&local_88,pXVar3);
      pvVar9 = (void *)0x17a5;
      printf("ACTVALUE_TEST XSValue returned,                                                        at line <%d> data=<%s>, datatype=<%s>\n"
             ,0x17a5,v_1);
      StrX::~StrX(&local_88);
      errSeen = 1;
      xercesc_4_0::XSValue::~XSValue(pXVar4);
      xercesc_4_0::XMemory::operator_delete((XMemory *)pXVar4,pvVar9);
    }
    myStatus = st_Init;
    StrX::StrX(&local_88,v_2);
    pXVar4 = (XSValue *)
             xercesc_4_0::XSValue::getActualValue
                       (local_88.fUnicodeForm,dt,&myStatus,ver_10,iVar11 == 2,
                        xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    StrX::~StrX(&local_88);
    if (pXVar4 == (XSValue *)0x0) {
      if (myStatus != st_NoActVal) {
        pXVar3 = getDataTypeString(dt);
        StrX::StrX(&local_88,pXVar3);
        pcVar1 = local_88.fLocalForm;
        pcVar5 = getStatusString(myStatus);
        printf("ACTVALUE_TEST Context Diff,                                                            at line <%d> data=<%s>, datatype=<%s>,                                                 expStatus=<%s>, actStatus=<%s>\n"
               ,0x17a6,v_2,pcVar1,"st_NoActVal",pcVar5);
        StrX::~StrX(&local_88);
        errSeen = 1;
      }
    }
    else {
      pXVar3 = getDataTypeString(dt);
      StrX::StrX(&local_88,pXVar3);
      pvVar9 = (void *)0x17a6;
      printf("ACTVALUE_TEST XSValue returned,                                                        at line <%d> data=<%s>, datatype=<%s>\n"
             ,0x17a6,v_2);
      StrX::~StrX(&local_88);
      errSeen = 1;
      xercesc_4_0::XSValue::~XSValue(pXVar4);
      xercesc_4_0::XMemory::operator_delete((XMemory *)pXVar4,pvVar9);
    }
    myStatus = st_Init;
    StrX::StrX(&local_88,v_3);
    pXVar4 = (XSValue *)
             xercesc_4_0::XSValue::getActualValue
                       (local_88.fUnicodeForm,dt,&myStatus,ver_10,iVar11 == 2,
                        xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    StrX::~StrX(&local_88);
    if (pXVar4 == (XSValue *)0x0) {
      if (myStatus != st_NoActVal) {
        pXVar3 = getDataTypeString(dt);
        StrX::StrX(&local_88,pXVar3);
        pcVar1 = local_88.fLocalForm;
        pcVar5 = getStatusString(myStatus);
        printf("ACTVALUE_TEST Context Diff,                                                            at line <%d> data=<%s>, datatype=<%s>,                                                 expStatus=<%s>, actStatus=<%s>\n"
               ,0x17a7,v_3,pcVar1,"st_NoActVal",pcVar5);
        StrX::~StrX(&local_88);
        errSeen = 1;
      }
    }
    else {
      pXVar3 = getDataTypeString(dt);
      StrX::StrX(&local_88,pXVar3);
      pvVar9 = (void *)0x17a7;
      printf("ACTVALUE_TEST XSValue returned,                                                        at line <%d> data=<%s>, datatype=<%s>\n"
             ,0x17a7,v_3);
      StrX::~StrX(&local_88);
      errSeen = 1;
      xercesc_4_0::XSValue::~XSValue(pXVar4);
      xercesc_4_0::XMemory::operator_delete((XMemory *)pXVar4,pvVar9);
    }
    myStatus = st_Init;
    StrX::StrX(&local_88,iv_1);
    pXVar4 = (XSValue *)
             xercesc_4_0::XSValue::getActualValue
                       (local_88.fUnicodeForm,dt,&myStatus,ver_10,iVar11 == 2,
                        xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    StrX::~StrX(&local_88);
    if (pXVar4 == (XSValue *)0x0) {
      SVar8 = (uint)(iVar11 == 2) * 3 + st_NoActVal;
      if (SVar8 != myStatus) {
        pXVar3 = getDataTypeString(dt);
        StrX::StrX(&local_88,pXVar3);
        pcVar1 = local_88.fLocalForm;
        pcVar5 = getStatusString(SVar8);
        pcVar6 = getStatusString(myStatus);
        printf("ACTVALUE_TEST Context Diff,                                                            at line <%d> data=<%s>, datatype=<%s>,                                                 expStatus=<%s>, actStatus=<%s>\n"
               ,0x17ab,iv_1,pcVar1,pcVar5,pcVar6);
        StrX::~StrX(&local_88);
        errSeen = 1;
      }
    }
    else {
      pXVar3 = getDataTypeString(dt);
      StrX::StrX(&local_88,pXVar3);
      pvVar9 = (void *)0x17ab;
      printf("ACTVALUE_TEST XSValue returned,                                                        at line <%d> data=<%s>, datatype=<%s>\n"
             ,0x17ab,iv_1);
      StrX::~StrX(&local_88);
      errSeen = 1;
      xercesc_4_0::XSValue::~XSValue(pXVar4);
      xercesc_4_0::XMemory::operator_delete((XMemory *)pXVar4,pvVar9);
    }
    myStatus = st_Init;
    StrX::StrX(&local_88,iv_2);
    pXVar4 = (XSValue *)
             xercesc_4_0::XSValue::getActualValue
                       (local_88.fUnicodeForm,dt,&myStatus,ver_10,iVar11 == 2,
                        xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    StrX::~StrX(&local_88);
    if (pXVar4 == (XSValue *)0x0) {
      SVar8 = (uint)(iVar11 == 2) * 3 + st_NoActVal;
      if (SVar8 != myStatus) {
        pXVar3 = getDataTypeString(dt);
        StrX::StrX(&local_88,pXVar3);
        pcVar1 = local_88.fLocalForm;
        pcVar5 = getStatusString(SVar8);
        pcVar6 = getStatusString(myStatus);
        printf("ACTVALUE_TEST Context Diff,                                                            at line <%d> data=<%s>, datatype=<%s>,                                                 expStatus=<%s>, actStatus=<%s>\n"
               ,0x17ad,iv_2,pcVar1,pcVar5,pcVar6);
        StrX::~StrX(&local_88);
        errSeen = 1;
      }
    }
    else {
      pXVar3 = getDataTypeString(dt);
      StrX::StrX(&local_88,pXVar3);
      pvVar9 = (void *)0x17ad;
      printf("ACTVALUE_TEST XSValue returned,                                                        at line <%d> data=<%s>, datatype=<%s>\n"
             ,0x17ad,iv_2);
      StrX::~StrX(&local_88);
      errSeen = 1;
      xercesc_4_0::XSValue::~XSValue(pXVar4);
      xercesc_4_0::XMemory::operator_delete((XMemory *)pXVar4,pvVar9);
    }
    myStatus = st_Init;
    StrX::StrX(&local_88,iv_3);
    pXVar4 = (XSValue *)
             xercesc_4_0::XSValue::getActualValue
                       (local_88.fUnicodeForm,dt,&myStatus,ver_10,iVar11 == 2,
                        xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    StrX::~StrX(&local_88);
    if (pXVar4 == (XSValue *)0x0) {
      SVar8 = (uint)(iVar11 == 2) * 3 + st_NoActVal;
      iVar11 = iVar10;
      if (SVar8 != myStatus) {
        pXVar3 = getDataTypeString(dt);
        StrX::StrX(&local_88,pXVar3);
        pcVar1 = local_88.fLocalForm;
        pcVar5 = getStatusString(SVar8);
        pcVar6 = getStatusString(myStatus);
        printf("ACTVALUE_TEST Context Diff,                                                            at line <%d> data=<%s>, datatype=<%s>,                                                 expStatus=<%s>, actStatus=<%s>\n"
               ,0x17af,iv_3,pcVar1,pcVar5,pcVar6);
        StrX::~StrX(&local_88);
        errSeen = 1;
      }
    }
    else {
      pXVar3 = getDataTypeString(dt);
      StrX::StrX(&local_88,pXVar3);
      pvVar9 = (void *)0x17af;
      printf("ACTVALUE_TEST XSValue returned,                                                        at line <%d> data=<%s>, datatype=<%s>\n"
             ,0x17af,iv_3);
      StrX::~StrX(&local_88);
      errSeen = 1;
      xercesc_4_0::XSValue::~XSValue(pXVar4);
      xercesc_4_0::XMemory::operator_delete((XMemory *)pXVar4,pvVar9);
      iVar11 = iVar10;
    }
  }
  iVar11 = 2;
LAB_00130cf0:
  iVar10 = iVar11 + -1;
  if (iVar11 == 0) {
    return;
  }
  myStatus = st_Init;
  StrX::StrX(&local_88,v_1);
  lVar7 = xercesc_4_0::XSValue::getCanonicalRepresentation
                    (local_88.fUnicodeForm,dt,&myStatus,ver_10,iVar11 == 2,
                     xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  StrX::~StrX(&local_88);
  if (lVar7 == 0) {
    if (myStatus != st_NoCanRep) {
      pXVar3 = getDataTypeString(dt);
      StrX::StrX(&local_88,pXVar3);
      pcVar1 = local_88.fLocalForm;
      pcVar5 = getStatusString(myStatus);
      printf("CANREP_TEST Context Diff,                                                             at line <%d> data=<%s>, datatype=<%s>\n                                               expStatus=<%s>, actStatus=<%s>\n"
             ,0x17cc,v_1,pcVar1,"st_NoCanRep",pcVar5);
      StrX::~StrX(&local_88);
      goto LAB_00130dda;
    }
  }
  else {
    pXVar3 = getDataTypeString(dt);
    StrX::StrX(&local_88,pXVar3);
    printf("CANREP_TEST CanRep returned:                                                          at line <%d> data=<%s>, datatype=<%s>\n"
           ,0x17cc,v_1);
    StrX::~StrX(&local_88);
    (**(code **)(*(long *)xercesc_4_0::XMLPlatformUtils::fgMemoryManager + 0x20))
              (xercesc_4_0::XMLPlatformUtils::fgMemoryManager,lVar7);
LAB_00130dda:
    errSeen = 1;
  }
  myStatus = st_Init;
  StrX::StrX(&local_88,v_2);
  lVar7 = xercesc_4_0::XSValue::getCanonicalRepresentation
                    (local_88.fUnicodeForm,dt,&myStatus,ver_10,iVar11 == 2,
                     xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  StrX::~StrX(&local_88);
  if (lVar7 == 0) {
    if (myStatus != st_NoCanRep) {
      pXVar3 = getDataTypeString(dt);
      StrX::StrX(&local_88,pXVar3);
      pcVar1 = local_88.fLocalForm;
      pcVar5 = getStatusString(myStatus);
      printf("CANREP_TEST Context Diff,                                                             at line <%d> data=<%s>, datatype=<%s>\n                                               expStatus=<%s>, actStatus=<%s>\n"
             ,0x17cd,v_2,pcVar1,"st_NoCanRep",pcVar5);
      StrX::~StrX(&local_88);
      goto LAB_00130ec1;
    }
  }
  else {
    pXVar3 = getDataTypeString(dt);
    StrX::StrX(&local_88,pXVar3);
    printf("CANREP_TEST CanRep returned:                                                          at line <%d> data=<%s>, datatype=<%s>\n"
           ,0x17cd,v_2);
    StrX::~StrX(&local_88);
    (**(code **)(*(long *)xercesc_4_0::XMLPlatformUtils::fgMemoryManager + 0x20))
              (xercesc_4_0::XMLPlatformUtils::fgMemoryManager,lVar7);
LAB_00130ec1:
    errSeen = 1;
  }
  myStatus = st_Init;
  StrX::StrX(&local_88,v_3);
  lVar7 = xercesc_4_0::XSValue::getCanonicalRepresentation
                    (local_88.fUnicodeForm,dt,&myStatus,ver_10,iVar11 == 2,
                     xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  StrX::~StrX(&local_88);
  if (lVar7 == 0) {
    if (myStatus != st_NoCanRep) {
      pXVar3 = getDataTypeString(dt);
      StrX::StrX(&local_88,pXVar3);
      pcVar1 = local_88.fLocalForm;
      pcVar5 = getStatusString(myStatus);
      printf("CANREP_TEST Context Diff,                                                             at line <%d> data=<%s>, datatype=<%s>\n                                               expStatus=<%s>, actStatus=<%s>\n"
             ,0x17ce,v_3,pcVar1,"st_NoCanRep",pcVar5);
      StrX::~StrX(&local_88);
      goto LAB_00130fa8;
    }
  }
  else {
    pXVar3 = getDataTypeString(dt);
    StrX::StrX(&local_88,pXVar3);
    printf("CANREP_TEST CanRep returned:                                                          at line <%d> data=<%s>, datatype=<%s>\n"
           ,0x17ce,v_3);
    StrX::~StrX(&local_88);
    (**(code **)(*(long *)xercesc_4_0::XMLPlatformUtils::fgMemoryManager + 0x20))
              (xercesc_4_0::XMLPlatformUtils::fgMemoryManager,lVar7);
LAB_00130fa8:
    errSeen = 1;
  }
  myStatus = st_Init;
  StrX::StrX(&local_88,iv_1);
  lVar7 = xercesc_4_0::XSValue::getCanonicalRepresentation
                    (local_88.fUnicodeForm,dt,&myStatus,ver_10,iVar11 == 2,
                     xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  StrX::~StrX(&local_88);
  if (lVar7 == 0) {
    SVar8 = (uint)(iVar11 == 2) * 4 + st_NoCanRep;
    if (SVar8 != myStatus) {
      pXVar3 = getDataTypeString(dt);
      StrX::StrX(&local_88,pXVar3);
      pcVar1 = local_88.fLocalForm;
      pcVar5 = getStatusString(SVar8);
      pcVar6 = getStatusString(myStatus);
      printf("CANREP_TEST Context Diff,                                                             at line <%d> data=<%s>, datatype=<%s>\n                                               expStatus=<%s>, actStatus=<%s>\n"
             ,0x17d2,iv_1,pcVar1,pcVar5,pcVar6);
      StrX::~StrX(&local_88);
      goto LAB_001310ab;
    }
  }
  else {
    pXVar3 = getDataTypeString(dt);
    StrX::StrX(&local_88,pXVar3);
    printf("CANREP_TEST CanRep returned:                                                          at line <%d> data=<%s>, datatype=<%s>\n"
           ,0x17d2,iv_1);
    StrX::~StrX(&local_88);
    (**(code **)(*(long *)xercesc_4_0::XMLPlatformUtils::fgMemoryManager + 0x20))
              (xercesc_4_0::XMLPlatformUtils::fgMemoryManager,lVar7);
LAB_001310ab:
    errSeen = 1;
  }
  myStatus = st_Init;
  StrX::StrX(&local_88,iv_2);
  lVar7 = xercesc_4_0::XSValue::getCanonicalRepresentation
                    (local_88.fUnicodeForm,dt,&myStatus,ver_10,iVar11 == 2,
                     xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  StrX::~StrX(&local_88);
  if (lVar7 == 0) {
    SVar8 = (uint)(iVar11 == 2) * 4 + st_NoCanRep;
    if (SVar8 != myStatus) {
      pXVar3 = getDataTypeString(dt);
      StrX::StrX(&local_88,pXVar3);
      pcVar1 = local_88.fLocalForm;
      pcVar5 = getStatusString(SVar8);
      pcVar6 = getStatusString(myStatus);
      printf("CANREP_TEST Context Diff,                                                             at line <%d> data=<%s>, datatype=<%s>\n                                               expStatus=<%s>, actStatus=<%s>\n"
             ,0x17d4,iv_2,pcVar1,pcVar5,pcVar6);
      StrX::~StrX(&local_88);
      goto LAB_001311ae;
    }
  }
  else {
    pXVar3 = getDataTypeString(dt);
    StrX::StrX(&local_88,pXVar3);
    printf("CANREP_TEST CanRep returned:                                                          at line <%d> data=<%s>, datatype=<%s>\n"
           ,0x17d4,iv_2);
    StrX::~StrX(&local_88);
    (**(code **)(*(long *)xercesc_4_0::XMLPlatformUtils::fgMemoryManager + 0x20))
              (xercesc_4_0::XMLPlatformUtils::fgMemoryManager,lVar7);
LAB_001311ae:
    errSeen = 1;
  }
  myStatus = st_Init;
  StrX::StrX(&local_88,iv_3);
  lVar7 = xercesc_4_0::XSValue::getCanonicalRepresentation
                    (local_88.fUnicodeForm,dt,&myStatus,ver_10,iVar11 == 2,
                     xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  StrX::~StrX(&local_88);
  if (lVar7 == 0) goto LAB_00131241;
  pXVar3 = getDataTypeString(dt);
  StrX::StrX(&local_88,pXVar3);
  printf("CANREP_TEST CanRep returned:                                                          at line <%d> data=<%s>, datatype=<%s>\n"
         ,0x17d6,iv_3);
  StrX::~StrX(&local_88);
  (**(code **)(*(long *)xercesc_4_0::XMLPlatformUtils::fgMemoryManager + 0x20))
            (xercesc_4_0::XMLPlatformUtils::fgMemoryManager,lVar7);
  goto LAB_001312b1;
LAB_00131241:
  SVar8 = (uint)(iVar11 == 2) * 4 + st_NoCanRep;
  iVar11 = iVar10;
  if (SVar8 != myStatus) {
    pXVar3 = getDataTypeString(dt);
    StrX::StrX(&local_88,pXVar3);
    pcVar1 = local_88.fLocalForm;
    pcVar5 = getStatusString(SVar8);
    pcVar6 = getStatusString(myStatus);
    printf("CANREP_TEST Context Diff,                                                             at line <%d> data=<%s>, datatype=<%s>\n                                               expStatus=<%s>, actStatus=<%s>\n"
           ,0x17d6,iv_3,pcVar1,pcVar5,pcVar6);
    StrX::~StrX(&local_88);
LAB_001312b1:
    errSeen = 1;
    iVar11 = iVar10;
  }
  goto LAB_00130cf0;
}

Assistant:

void test_dt_NCName_ID_IDREF_ENTITY(XSValue::DataType dt)
{
    bool  toValidate = true;

    const char v_1[]="Four-_.";
    const char v_2[]="_Zeerochert";
    const char v_3[]="L007";

    const char iv_1[]=":Four-_.";
    const char iv_2[]="_Zeerochert:";
    const char iv_3[]="0:07";

    XSValue::XSValue_Data act_v_ran_v_1;  act_v_ran_v_1.fValue.f_strVal = 0;
    XSValue::XSValue_Data act_v_ran_v_2;  act_v_ran_v_2.fValue.f_strVal = 0;
    XSValue::XSValue_Data act_v_ran_v_3;  act_v_ran_v_3.fValue.f_strVal = 0;
    /***
     *
     * validate
     * ---------
     *                             availability        return value      context
     *                             ----------------------------------------------
     *     valid                                       true              n/a
     *     invalid                      n/a            false             st_FOCA0002
     *
     ***/

    //  valid
    VALIDATE_TEST(v_1,   dt, EXP_RET_VALID_TRUE,  DONT_CARE);
    VALIDATE_TEST(v_2,   dt, EXP_RET_VALID_TRUE,  DONT_CARE);
    VALIDATE_TEST(v_3,   dt, EXP_RET_VALID_TRUE,  DONT_CARE);

    //  invalid
    VALIDATE_TEST(iv_1,  dt, EXP_RET_VALID_FALSE,  DONT_CARE);
    VALIDATE_TEST(iv_2,  dt, EXP_RET_VALID_FALSE,  DONT_CARE);
    VALIDATE_TEST(iv_3,  dt, EXP_RET_VALID_FALSE,  DONT_CARE);

    /***
     *
     * getActualValue
     * ---------------
     *                             availability        return value      context
     *                             ----------------------------------------------
     *  validation on
     *  =============
     *   valid                                             0             st_NoActVal
     *   invalid                                           0             st_FOCA0002
     *
     *  validation off
     *  ==============
     *   valid                                             0             st_NoActVal
     *   invalid                                           0             st_NoActVal
     *
     ***/

    for (int i = 0; i < 2; i++)
    {
        //validation on/off
        toValidate = ( 0 == i) ? true : false;

        //  valid
        ACTVALUE_TEST(v_1,  dt, toValidate, EXP_RET_VALUE_FALSE, XSValue::st_NoActVal, act_v_ran_v_1);
        ACTVALUE_TEST(v_2,  dt, toValidate, EXP_RET_VALUE_FALSE, XSValue::st_NoActVal, act_v_ran_v_2);
        ACTVALUE_TEST(v_3,  dt, toValidate, EXP_RET_VALUE_FALSE, XSValue::st_NoActVal, act_v_ran_v_3);

        //  invalid
        ACTVALUE_TEST(iv_1,  dt, toValidate, EXP_RET_VALUE_FALSE,
            (toValidate ? XSValue::st_FOCA0002 : XSValue::st_NoActVal), act_v_ran_v_1);
        ACTVALUE_TEST(iv_2,  dt, toValidate, EXP_RET_VALUE_FALSE,
            (toValidate ? XSValue::st_FOCA0002 : XSValue::st_NoActVal), act_v_ran_v_1);
        ACTVALUE_TEST(iv_3,  dt, toValidate, EXP_RET_VALUE_FALSE,
            (toValidate ? XSValue::st_FOCA0002 : XSValue::st_NoActVal), act_v_ran_v_1);

    }

    /***
     *
     * getCanonicalRepresentation
     * ---------------------------
     *                             availability        return value      context
     *                             ----------------------------------------------
     *
     *  validation on
     *  =============
     *   valid                                            0              st_NoCanRep
     *   invalid                                          0              st_FOCA0002
     *
     *  validation off
     *  ==============
     *   valid                                            0              st_NoCanRep
     *   invalid                                          0              st_NoCanRep
     *
     ***/

    for (int j = 0; j < 2; j++)
    {
        //validation on/off
        toValidate = ( 0 == j) ? true : false;

        //  valid
        CANREP_TEST(v_1,  dt, toValidate, EXP_RET_CANREP_FALSE, null_string, XSValue::st_NoCanRep);
        CANREP_TEST(v_2,  dt, toValidate, EXP_RET_CANREP_FALSE, null_string, XSValue::st_NoCanRep);
        CANREP_TEST(v_3,  dt, toValidate, EXP_RET_CANREP_FALSE, null_string, XSValue::st_NoCanRep);

        //  invalid
        CANREP_TEST(iv_1,  dt, toValidate, EXP_RET_CANREP_FALSE, null_string,
            (toValidate ? XSValue::st_FOCA0002 : XSValue::st_NoCanRep));
        CANREP_TEST(iv_2,  dt, toValidate, EXP_RET_CANREP_FALSE, null_string,
            (toValidate ? XSValue::st_FOCA0002 : XSValue::st_NoCanRep));
        CANREP_TEST(iv_3,  dt, toValidate, EXP_RET_CANREP_FALSE, null_string,
            (toValidate ? XSValue::st_FOCA0002 : XSValue::st_NoCanRep));

    }

}